

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModelHandle.cpp
# Opt level: O0

bool __thiscall
Rml::DataModelConstructor::BindFunc
          (DataModelConstructor *this,String *name,DataGetFunc *get_func,DataSetFunc *set_func)

{
  DataModel *this_00;
  bool bVar1;
  function<void_(const_Rml::Variant_&)> local_68;
  function<void_(Rml::Variant_&)> local_48;
  DataSetFunc *local_28;
  DataSetFunc *set_func_local;
  DataGetFunc *get_func_local;
  String *name_local;
  DataModelConstructor *this_local;
  
  this_00 = this->model;
  local_28 = set_func;
  set_func_local = (DataSetFunc *)get_func;
  get_func_local = (DataGetFunc *)name;
  name_local = (String *)this;
  ::std::function<void_(Rml::Variant_&)>::function(&local_48,get_func);
  ::std::function<void_(const_Rml::Variant_&)>::function(&local_68,set_func);
  bVar1 = DataModel::BindFunc(this_00,name,&local_48,&local_68);
  ::std::function<void_(const_Rml::Variant_&)>::~function(&local_68);
  ::std::function<void_(Rml::Variant_&)>::~function(&local_48);
  return bVar1;
}

Assistant:

bool DataModelConstructor::BindFunc(const String& name, DataGetFunc get_func, DataSetFunc set_func)
{
	return model->BindFunc(name, std::move(get_func), std::move(set_func));
}